

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_int.hpp
# Opt level: O2

size_t ans_int_compress(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  uint8_t *puVar1;
  uint64_t uVar2;
  long lVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  array<unsigned_long,_4UL> states;
  ans_int_encode ans_frame;
  uint8_t *local_a8;
  long local_a0;
  uint8_t *local_98;
  uint64_t local_90 [4];
  ans_int_encode local_70;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  ans_int_encode::create(&local_70,src,srcSize);
  local_a8 = dst;
  ans_int_encode::serialize(&local_70,&local_a8);
  uVar2 = local_70.lower_bound;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    local_90[lVar4] = uVar2;
  }
  local_a0 = std::chrono::_V2::system_clock::now();
  get_stats::s.prelude_time_ns = local_a0 - lVar3;
  get_stats::s.prelude_bytes = (long)local_a8 - (long)dst;
  local_98 = dst;
  for (lVar3 = 0; -lVar3 != (ulong)((uint)srcSize & 3); lVar3 = lVar3 + -1) {
    ans_int_encode::encode_symbol(&local_70,local_90,src[srcSize + lVar3 + -1],&local_a8);
  }
  for (uVar6 = srcSize & 0xfffffffffffffffc; puVar1 = local_98, uVar6 != 0; uVar6 = uVar6 - 4) {
    ans_int_encode::encode_symbol(&local_70,local_90,src[uVar6 - 1],&local_a8);
    ans_int_encode::encode_symbol(&local_70,local_90 + 1,src[uVar6 - 2],&local_a8);
    ans_int_encode::encode_symbol(&local_70,local_90 + 2,src[uVar6 - 3],&local_a8);
    ans_int_encode::encode_symbol(&local_70,local_90 + 3,src[uVar6 - 4],&local_a8);
  }
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
    *(uint64_t *)(local_a8 + lVar3) = *(long *)((long)local_90 + lVar3) - local_70.lower_bound;
  }
  local_a8 = local_a8 + 0x20;
  lVar3 = std::chrono::_V2::system_clock::now();
  get_stats::s.encode_time_ns = lVar3 - local_a0;
  sVar5 = (long)local_a8 - (long)puVar1;
  get_stats::s.encode_bytes = (long)local_a8 - (long)(puVar1 + get_stats::s.prelude_bytes);
  ans_int_encode::~ans_int_encode(&local_70);
  return sVar5;
}

Assistant:

size_t ans_int_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    const uint32_t num_states = 4;
#ifdef RECORD_STATS
    auto start_compress = std::chrono::high_resolution_clock::now();
#endif

    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_int_encode::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    std::array<uint64_t, num_states> states;

    // start encoding
    for (uint32_t i = 0; i < num_states; i++)
        states[i] = ans_frame.initial_state();

#ifdef RECORD_STATS
    auto stop_prelude = std::chrono::high_resolution_clock::now();
    get_stats().prelude_bytes = out_u8 - reinterpret_cast<uint8_t*>(dst);
    get_stats().prelude_time_ns = (stop_prelude - start_compress).count();
#endif

    // std::cout << "encoding" << std::endl;
    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % num_states != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += num_states;
    }

    // flush final state
    for (uint32_t i = 0; i < num_states; i++)
        ans_frame.flush_state(states[i], out_u8);

#ifdef RECORD_STATS
    auto stop_compress = std::chrono::high_resolution_clock::now();
    get_stats().encode_bytes = (out_u8 - reinterpret_cast<uint8_t*>(dst))
        - get_stats().prelude_bytes;
    get_stats().encode_time_ns = (stop_compress - stop_prelude).count();
#endif

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}